

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimized.cpp
# Opt level: O1

void anon_unknown.dwarf_2760b7::writeFile
               (char *pFilename,int pHeight,int pWidth,EImageType pImageType,bool pIsStereo,
               Compression pCompression)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint pNbChannels;
  Channel *pCVar2;
  Slice *pSVar3;
  int iVar4;
  half *phVar5;
  char *pcVar6;
  ulong uVar7;
  long lVar8;
  half *phVar9;
  long lVar10;
  half *phVar11;
  undefined8 *puVar12;
  int pWidth_local;
  int pHeight_local;
  half *local_158;
  ulong local_150;
  StringVector multiView;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  OutputFile lFile;
  Array2D<Imath_3_2::half> lPixels;
  Array2D<Imath_3_2::half> lPixelsLeft;
  FrameBuffer lOutputFrameBuffer;
  Header header;
  
  local_158 = (half *)CONCAT44(local_158._4_4_,pCompression);
  pNbChannels = *(uint *)("\t\tRGBA file to RGBA framebuffer" + (long)(int)pImageType * 4 + 0x1f);
  phVar11 = (half *)(ulong)pNbChannels;
  lPixels._sizeX = 0;
  lPixels._sizeY = 0;
  lPixels._data = (half *)0x0;
  local_150 = CONCAT44(local_150._4_4_,pHeight);
  lVar10 = (long)pHeight;
  lVar8 = (long)(int)(pNbChannels * pWidth);
  uVar7 = 0xffffffffffffffff;
  if (-1 < lVar8 * lVar10) {
    uVar7 = lVar8 * lVar10 * 2;
  }
  pWidth_local = pWidth;
  pHeight_local = pHeight;
  phVar5 = (half *)operator_new__(uVar7);
  if (lPixels._data != (half *)0x0) {
    operator_delete__(lPixels._data);
  }
  lPixels._sizeX = lVar10;
  lPixels._sizeY = lVar8;
  lPixels._data = phVar5;
  fillPixels(&pHeight_local,&pWidth_local,&lPixels,pNbChannels,false);
  if (pIsStereo) {
    lPixelsLeft._sizeX = 0;
    lPixelsLeft._sizeY = 0;
    lPixelsLeft._data = (half *)0x0;
    phVar5 = (half *)operator_new__(uVar7);
    if (lPixelsLeft._data != (half *)0x0) {
      operator_delete__(lPixelsLeft._data);
    }
    lPixelsLeft._sizeX = lVar10;
    lPixelsLeft._sizeY = lVar8;
    lPixelsLeft._data = phVar5;
    fillPixels(&pHeight_local,&pWidth_local,&lPixelsLeft,pNbChannels,true);
    local_120._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              (&header,pWidth,(int)local_150,1.0,(Vec2 *)&local_120,1.0,INCREASING_Y,
               (Compression)local_158);
    lVar8 = 0;
    phVar9 = phVar11;
    local_158 = phVar5;
    do {
      pcVar6 = (char *)Imf_3_2::Header::channels();
      pCVar2 = *(Channel **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar8);
      Imf_3_2::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar6,pCVar2);
      pcVar6 = (char *)Imf_3_2::Header::channels();
      pCVar2 = *(Channel **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar8);
      Imf_3_2::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar6,pCVar2);
      lVar8 = lVar8 + 8;
      phVar9 = (half *)((long)&phVar9[-1]._h + 1);
    } while (phVar9 != (half *)0x0);
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    multiView.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    paVar1 = &local_120.field_2;
    local_120.field_2._M_allocated_capacity._0_4_ = 0x68676972;
    local_120.field_2._M_local_buf[4] = 't';
    local_120.field_2._M_local_buf[5] = '\0';
    local_120._M_string_length = 5;
    local_120._M_dataplus._M_p = (pointer)paVar1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               &local_120);
    phVar5 = local_158;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 local_120.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    local_120.field_2._M_allocated_capacity._0_4_ = 0x7466656c;
    local_120._M_string_length = 4;
    local_120.field_2._M_local_buf[4] = '\0';
    local_120._M_dataplus._M_p = (pointer)paVar1;
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&multiView,
               &local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p,
                      CONCAT26(local_120.field_2._M_allocated_capacity._6_2_,
                               CONCAT15(local_120.field_2._M_local_buf[5],
                                        CONCAT14(local_120.field_2._M_local_buf[4],
                                                 local_120.field_2._M_allocated_capacity._0_4_))) +
                      1);
    }
    Imf_3_2::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::TypedAttribute((vector *)&local_120);
    Imf_3_2::Header::insert((char *)&header,(Attribute *)"multiView");
    Imf_3_2::TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
    ::~TypedAttribute((TypedAttribute<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                       *)&local_120);
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile(&lFile,pFilename,&header,iVar4);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar7 = (ulong)(pNbChannels * 2);
    local_150 = (long)pWidth_local * uVar7;
    lVar8 = 0;
    phVar9 = lPixels._data;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES + lVar8);
      Imf_3_2::Slice::Slice
                ((Slice *)&local_120,HALF,(char *)phVar9,uVar7,local_150,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar3);
      pSVar3 = *(Slice **)((long)&(anonymous_namespace)::CHANNEL_NAMES_LEFT + lVar8);
      Imf_3_2::Slice::Slice
                ((Slice *)&local_120,HALF,(char *)phVar5,uVar7,local_150,1,1,0.0,false,false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar3);
      phVar5 = phVar5 + 1;
      lVar8 = lVar8 + 8;
      phVar9 = phVar9 + 1;
      phVar11 = (half *)((long)&phVar11[-1]._h + 1);
    } while (phVar11 != (half *)0x0);
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&lFile);
    Imf_3_2::OutputFile::writePixels((int)&lFile);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_3_2::OutputFile::~OutputFile(&lFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&multiView);
    Imf_3_2::Header::~Header(&header);
    if (lPixelsLeft._data != (half *)0x0) {
      operator_delete__(lPixelsLeft._data);
    }
  }
  else {
    local_120._M_dataplus._M_p = (pointer)0x0;
    Imf_3_2::Header::Header
              (&header,pWidth,(int)local_150,1.0,(Vec2 *)&local_120,1.0,INCREASING_Y,
               (Compression)local_158);
    puVar12 = &(anonymous_namespace)::CHANNEL_NAMES;
    local_158 = phVar11;
    do {
      pcVar6 = (char *)Imf_3_2::Header::channels();
      pCVar2 = (Channel *)*puVar12;
      Imf_3_2::Channel::Channel((Channel *)&local_120,HALF,1,1,false);
      Imf_3_2::ChannelList::insert(pcVar6,pCVar2);
      puVar12 = puVar12 + 1;
      phVar11 = (half *)((long)&phVar11[-1]._h + 1);
    } while (phVar11 != (half *)0x0);
    iVar4 = Imf_3_2::globalThreadCount();
    Imf_3_2::OutputFile::OutputFile((OutputFile *)&multiView,pFilename,&header,iVar4);
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    uVar7 = (ulong)(uint)((int)local_158 * 2);
    puVar12 = &(anonymous_namespace)::CHANNEL_NAMES;
    phVar11 = local_158;
    lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         lOutputFrameBuffer._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      pSVar3 = (Slice *)*puVar12;
      Imf_3_2::Slice::Slice
                ((Slice *)&local_120,HALF,(char *)phVar5,uVar7,(long)pWidth * uVar7,1,1,0.0,false,
                 false);
      Imf_3_2::FrameBuffer::insert((char *)&lOutputFrameBuffer,pSVar3);
      phVar5 = phVar5 + 1;
      puVar12 = puVar12 + 1;
      phVar11 = (half *)((long)&phVar11[-1]._h + 1);
    } while (phVar11 != (half *)0x0);
    Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&multiView);
    Imf_3_2::OutputFile::writePixels((int)&multiView);
    std::
    _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
    ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                 *)&lOutputFrameBuffer);
    Imf_3_2::OutputFile::~OutputFile((OutputFile *)&multiView);
    Imf_3_2::Header::~Header(&header);
  }
  if (lPixels._data != (half *)0x0) {
    operator_delete__(lPixels._data);
  }
  return;
}

Assistant:

void
writeFile (
    const char  pFilename[],
    int         pHeight,
    int         pWidth,
    EImageType  pImageType,
    bool        pIsStereo,
    Compression pCompression)
{
    const int     lNbChannels = getNbChannels (pImageType);
    Array2D<half> lPixels;

    lPixels.resizeErase (pHeight, pWidth * lNbChannels);
    fillPixels (pHeight, pWidth, lPixels, lNbChannels, false);

    if (pIsStereo)
    {
        Array2D<half> lPixelsLeft;

        lPixelsLeft.resizeErase (pHeight, pWidth * lNbChannels);
        fillPixels (pHeight, pWidth, lPixelsLeft, lNbChannels, true);

        writePixels (
            pFilename,
            pHeight,
            pWidth,
            lPixels,
            lPixelsLeft,
            lNbChannels,
            pCompression);
    }
    else
    {
        writePixels (
            pFilename, pHeight, pWidth, lPixels, lNbChannels, pCompression);
    }
}